

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool ON_SubDEdgeSharpness::IsConstant(size_t edge_count,ON_SubDEdgePtr *edges,bool bCreaseResult)

{
  bool bVar1;
  ON_SubDVertex *pOVar2;
  double dVar3;
  double dVar4;
  ulong local_40;
  size_t i;
  double c;
  ON_SubDEdgeSharpness s;
  bool bCreaseResult_local;
  ON_SubDEdgePtr *edges_local;
  size_t edge_count_local;
  
  if ((edge_count == 0) || (edges == (ON_SubDEdgePtr *)0x0)) {
    edge_count_local._7_1_ = false;
  }
  else {
    s.m_edge_sharpness[0]._3_1_ = bCreaseResult;
    unique0x1000018b = edges;
    register0x00001200 = ON_SubDEdgePtr::RelativeSharpness(edges,true);
    bVar1 = IsConstant((ON_SubDEdgeSharpness *)((long)&c + 4),
                       (bool)(s.m_edge_sharpness[0]._3_1_ & 1));
    if (bVar1) {
      dVar3 = operator[]((ON_SubDEdgeSharpness *)((long)&c + 4),0);
      pOVar2 = ON_SubDEdgePtr::RelativeVertex(stack0xffffffffffffffe0,0);
      if (pOVar2 == (ON_SubDVertex *)0x0) {
        edge_count_local._7_1_ = false;
      }
      else {
        for (local_40 = 0; local_40 < edge_count; local_40 = local_40 + 1) {
          register0x00001200 =
               ON_SubDEdgePtr::RelativeSharpness(stack0xffffffffffffffe0 + local_40,true);
          dVar4 = EndSharpness((ON_SubDEdgeSharpness *)((long)&c + 4),0);
          bVar1 = false;
          if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
            dVar4 = EndSharpness((ON_SubDEdgeSharpness *)((long)&c + 4),1);
            bVar1 = dVar3 == dVar4;
          }
          if (!bVar1) {
            return false;
          }
        }
        edge_count_local._7_1_ = true;
      }
    }
    else {
      edge_count_local._7_1_ = false;
    }
  }
  return edge_count_local._7_1_;
}

Assistant:

bool ON_SubDEdgeSharpness::IsConstant(
  size_t edge_count,
  const ON_SubDEdgePtr* edges,
  bool bCreaseResult
)
{
  if (edge_count < 1 || nullptr == edges)
    return false;
  
  ON_SubDEdgeSharpness s = edges[0].RelativeSharpness(true);
  if (false == s.IsConstant(bCreaseResult))
    return false;
  const double c = s[0];
  if (nullptr == edges[0].RelativeVertex(0))
    return false; // not an edge chain
  for (size_t i = 0; i < edge_count; ++i)
  {
    s = edges[i].RelativeSharpness(true);
    if ( false == (c == s.EndSharpness(0) && c == s.EndSharpness(1)))
      return false;
  }

  return true;
}